

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O0

decNumber_conflict *
decNumberMultiply(decNumber_conflict *res,decNumber_conflict *lhs,decNumber_conflict *rhs,
                 decContext *set)

{
  uint32_t local_2c;
  decContext *pdStack_28;
  uint32_t status;
  decContext *set_local;
  decNumber_conflict *rhs_local;
  decNumber_conflict *lhs_local;
  decNumber_conflict *res_local;
  
  local_2c = 0;
  pdStack_28 = set;
  set_local = (decContext *)rhs;
  rhs_local = lhs;
  lhs_local = res;
  decMultiplyOp(res,lhs,rhs,set,&local_2c);
  if (local_2c != 0) {
    decStatus(lhs_local,local_2c,pdStack_28);
  }
  return lhs_local;
}

Assistant:

decNumber * decNumberMultiply(decNumber *res, const decNumber *lhs,
			      const decNumber *rhs, decContext *set) {
  uInt status=0;		   /* accumulator */
  decMultiplyOp(res, lhs, rhs, set, &status);
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }